

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

void __thiscall Sequence::process_maxgap(Sequence *this,Eqclass_S *L2)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var4;
  element_type *peVar5;
  shared_ptr<Itemset> *psVar6;
  element_type *peVar7;
  ListNodes<std::shared_ptr<Itemset>_> local_b0;
  int local_8c;
  undefined1 local_88 [4];
  int clsnum_1;
  shared_ptr<Itemset> item_1;
  ListNodes<std::shared_ptr<Itemset>_> local_68;
  int local_48;
  int clsnum;
  undefined1 local_38 [8];
  shared_ptr<Itemset> item;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr;
  Eqclass_S *L2_local;
  Sequence *this_local;
  
  peVar3 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)L2);
  p_Var4 = (__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)Eqclass::list(peVar3);
  std::
  __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(p_Var4);
  Lists<std::shared_ptr<Itemset>_>::head
            ((Lists<std::shared_ptr<Itemset>_> *)
             &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  while( true ) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar1) break;
    peVar5 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar5);
    std::shared_ptr<Itemset>::shared_ptr((shared_ptr<Itemset> *)local_38,psVar6);
    peVar7 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    local_48 = Itemset::operator[](peVar7,0);
    peVar5 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar5);
    std::shared_ptr<Itemset>::shared_ptr(&local_68.theItem,psVar6);
    peVar3 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)L2
                       );
    uVar2 = Eqclass::templ(peVar3);
    process_itemset(this,&local_68.theItem,uVar2,3);
    std::shared_ptr<Itemset>::~shared_ptr(&local_68.theItem);
    std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_38);
    std::
    __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ListNodes<std::shared_ptr<Itemset>_>::next(&local_68);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
               &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_68.theNext);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&local_68.theNext);
  }
  peVar3 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)L2);
  p_Var4 = (__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)Eqclass::list2(peVar3);
  std::
  __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(p_Var4);
  Lists<std::shared_ptr<Itemset>_>::head
            ((Lists<std::shared_ptr<Itemset>_> *)
             &item_1.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &item_1.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &item_1.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  while( true ) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar1) break;
    peVar5 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar5);
    std::shared_ptr<Itemset>::shared_ptr((shared_ptr<Itemset> *)local_88,psVar6);
    peVar7 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_88);
    local_8c = Itemset::operator[](peVar7,0);
    peVar5 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar5);
    std::shared_ptr<Itemset>::shared_ptr(&local_b0.theItem,psVar6);
    peVar3 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)L2
                       );
    uVar2 = Eqclass::templ2(peVar3);
    process_itemset(this,&local_b0.theItem,uVar2,3);
    std::shared_ptr<Itemset>::~shared_ptr(&local_b0.theItem);
    std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_88);
    std::
    __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ListNodes<std::shared_ptr<Itemset>_>::next(&local_b0);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
               &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_b0.theNext);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&local_b0.theNext);
  }
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Sequence::process_maxgap(Eqclass_S L2) {
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr = L2->list()->head();
    for (; hdr; hdr = hdr->next()) {
        auto item = hdr->item();
        auto clsnum = (*item)[0];
        process_itemset(hdr->item(), L2->templ(), 3);
    }

    hdr = L2->list2()->head();
    for (; hdr; hdr = hdr->next()) {
        auto item = hdr->item();
        auto clsnum = (*item)[0];
        process_itemset(hdr->item(), L2->templ2(), 3);
    }
}